

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.hpp
# Opt level: O0

void __thiscall
Centaurus::MyConstPool::load_charclass_filter<char>
          (MyConstPool *this,X86Xmm *dest,CharClass<char> *cc)

{
  Operand_ *in_stack_ffffffffffffff18;
  uint32_t instId;
  size_t offset;
  Data128 data;
  CharClass<char> *cc_local;
  X86Xmm *dest_local;
  MyConstPool *this_local;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  uint32_t signature;
  undefined4 local_6c;
  void *in_stack_ffffffffffffff98;
  ConstPool *in_stack_ffffffffffffffa0;
  
  instId = (uint32_t)((ulong)dest >> 0x20);
  pack_charclass(cc);
  asmjit::ConstPool::add
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,CONCAT44(local_6c,signature),
             (size_t *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  asmjit::CodeEmitter::emit((CodeEmitter *)0xa,instId,(Operand_ *)this,in_stack_ffffffffffffff18);
  return;
}

Assistant:

void load_charclass_filter(asmjit::X86Xmm dest, const CharClass<TCHAR>& cc)
    {
        asmjit::Data128 data = pack_charclass(cc);

        size_t offset;
        m_pool.add(&data, 16, offset);

        m_as.movdqa(dest, asmjit::X86Mem(m_label, offset));
    }